

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample.cpp
# Opt level: O2

void ncnn::interpolate_cubic(float fx,float *coeffs)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = fx + 1.0;
  fVar3 = 1.0 - fx;
  fVar2 = fVar1 * -6.0 + 3.0 + (fVar1 * -0.75 + 3.75) * fVar1 * fVar1;
  *coeffs = fVar2;
  fVar1 = (fVar3 * 1.25 + -2.25) * fVar3 * fVar3;
  fVar3 = (fx * 1.25 + -2.25) * fx * fx + 1.0;
  *(ulong *)(coeffs + 1) = CONCAT44(fVar1 + 1.0,fVar3);
  coeffs[3] = -(fVar1 + fVar3 + fVar2);
  return;
}

Assistant:

static inline void interpolate_cubic(float fx, float* coeffs)
{
    const float A = -0.75f;

    float fx0 = fx + 1;
    float fx1 = fx;
    float fx2 = 1 - fx;
    // float fx3 = 2 - fx;

    coeffs[0] = A * fx0 * fx0 * fx0 - 5 * A * fx0 * fx0 + 8 * A * fx0 - 4 * A;
    coeffs[1] = (A + 2) * fx1 * fx1 * fx1 - (A + 3) * fx1 * fx1 + 1;
    coeffs[2] = (A + 2) * fx2 * fx2 * fx2 - (A + 3) * fx2 * fx2 + 1;
    coeffs[3] = 1.f - coeffs[0] - coeffs[1] - coeffs[2];
}